

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_vector_operators.cpp
# Opt level: O2

void __thiscall
test_vector_operators_mean_Test::~test_vector_operators_mean_Test
          (test_vector_operators_mean_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(test_vector_operators, mean) {
  Vector_Dense<Scalar, 0> dynamic_vector = {1.0, -2.0, 3.0, 4.0};
  Vector_Dense<Scalar, 4> static_vector = {1.0, -2.0, 3.0, -4.0};
  EXPECT_DOUBLE_EQ(mean(dynamic_vector), 6.0 / 4.0);
  EXPECT_DOUBLE_EQ(mean(static_vector), -2.0 / 4.0);

  Vector_Dense<Scalar, 0> zero_size;
  EXPECT_DEATH(mean(zero_size), "./*");
}